

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_59e0::StreambufStream::~StreambufStream(StreambufStream *this)

{
  void *in_RDI;
  StreambufStream *in_stack_00000030;
  
  ~StreambufStream(in_stack_00000030);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~StreambufStream()
    {
        EXPECT_TRUE(_destructed) << "ktxStream should have been destructed";
    }